

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_>::InitializePage
          (ModeState<duckdb::hugeint_t,_duckdb::ModeStandard<duckdb::hugeint_t>_> *this,
          WindowPartitionInput *partition)

{
  ColumnDataCollection *pCVar1;
  ColumnDataScanState *pCVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  pCVar2 = this->scan;
  if (pCVar2 == (ColumnDataScanState *)0x0) {
    pCVar2 = (ColumnDataScanState *)operator_new(0x80);
    *(undefined8 *)&(pCVar2->current_chunk_state).handles._M_h._M_rehash_policy = 0;
    (pCVar2->current_chunk_state).handles._M_h._M_rehash_policy._M_next_resize = 0;
    (pCVar2->current_chunk_state).handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
    *(undefined8 *)&(pCVar2->current_chunk_state).properties = 0;
    *(undefined8 *)&pCVar2->properties = 0;
    (pCVar2->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pCVar2->segment_index = 0;
    pCVar2->chunk_index = 0;
    pCVar2->current_row_index = 0;
    pCVar2->next_row_index = 0;
    (pCVar2->current_chunk_state).handles._M_h._M_buckets =
         &(pCVar2->current_chunk_state).handles._M_h._M_single_bucket;
    (pCVar2->current_chunk_state).handles._M_h._M_bucket_count = 1;
    (pCVar2->current_chunk_state).handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pCVar2->current_chunk_state).handles._M_h._M_element_count = 0;
    (pCVar2->current_chunk_state).handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pCVar2->current_chunk_state).handles._M_h._M_rehash_policy._M_next_resize = 0;
    (pCVar2->current_chunk_state).handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (pCVar2->current_chunk_state).properties = INVALID;
    (pCVar2->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pCVar2->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pCVar2->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->scan = pCVar2;
  }
  if (*(long *)&this->field_0x58 == *(long *)&this->page) {
    pCVar1 = *(ColumnDataCollection **)(partition + 8);
    this->inputs = pCVar1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_40,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(partition + 0x18)
              );
    duckdb::ColumnDataCollection::InitializeScan(pCVar1,pCVar2,&local_40,1);
    if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    duckdb::ColumnDataCollection::InitializeScanChunk
              ((ColumnDataScanState *)this->inputs,(DataChunk *)this->scan);
  }
  return;
}

Assistant:

void InitializePage(const WindowPartitionInput &partition) {
		if (!scan) {
			scan = new ColumnDataScanState();
		}
		if (page.ColumnCount() == 0) {
			D_ASSERT(partition.inputs);
			inputs = partition.inputs;
			D_ASSERT(partition.column_ids.size() == 1);
			inputs->InitializeScan(*scan, partition.column_ids);
			inputs->InitializeScanChunk(*scan, page);
		}
	}